

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O3

int Ssc_GiaClassesRefine(Gia_Man_t *p)

{
  word *pwVar1;
  ulong uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int Entry;
  long lVar9;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscClass.c"
                  ,0x11c,"int Ssc_GiaClassesRefine(Gia_Man_t *)");
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_00->pArray = piVar4;
  if (p->nObjs < 1) {
    iVar8 = 0;
LAB_009151b3:
    Ssc_GiaSimProcessRefined(p,p_00);
    iVar3 = p_00->nSize;
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
    }
    free(p_00);
    return iVar3 + iVar8;
  }
  lVar9 = 0;
  iVar8 = 0;
LAB_00915095:
  if (p->pObjs != (Gia_Obj_t *)0x0) {
    uVar7 = *(uint *)(p->pObjs + lVar9);
    uVar6 = ~uVar7;
    if (((uVar6 & 0x9fffffff) == 0) || (-1 < (int)uVar7 && (uVar6 & 0x1fffffff) != 0)) {
      uVar7 = (uint)p->pReprs[lVar9] & 0xfffffff;
      if (uVar7 == 0) {
LAB_009150fe:
        uVar2 = (long)p->vSimsPi->nSize / (long)(p->vCis->nSize - p->nRegs);
        iVar3 = (int)uVar2;
        Entry = (int)lVar9;
        uVar7 = iVar3 * Entry;
        if (((int)uVar7 < 0) || (p->vSims->nSize <= (int)uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pwVar1 = p->vSims->pArray;
        if ((pwVar1[uVar7] & 1) == 0) {
          if (0 < iVar3) {
            uVar5 = 0;
            do {
              if (pwVar1[(uint)(Entry * iVar3) + uVar5] != 0) goto LAB_00915186;
              uVar5 = uVar5 + 1;
            } while ((uVar2 & 0xffffffff) != uVar5);
          }
        }
        else if (0 < iVar3) {
          uVar5 = 0;
          do {
            if (pwVar1[(uint)(Entry * iVar3) + uVar5] != 0xffffffffffffffff) goto LAB_00915186;
            uVar5 = uVar5 + 1;
          } while ((uVar2 & 0xffffffff) != uVar5);
        }
      }
      else if (uVar7 != 0xfffffff) {
        if (p->pNexts[lVar9] < 1) {
          iVar3 = Ssc_GiaSimClassRefineOne(p,uVar7);
          iVar8 = iVar8 + iVar3;
        }
        else if (uVar7 == 0) goto LAB_009150fe;
      }
    }
    goto LAB_0091519e;
  }
  goto LAB_009151b3;
LAB_00915186:
  Vec_IntPush(p_00,Entry);
LAB_0091519e:
  lVar9 = lVar9 + 1;
  if (p->nObjs <= lVar9) goto LAB_009151b3;
  goto LAB_00915095;
}

Assistant:

int Ssc_GiaClassesRefine( Gia_Man_t * p )
{
    Vec_Int_t * vRefinedC;
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    assert( p->pReprs != NULL );
    vRefinedC = Vec_IntAlloc( 100 );
    Gia_ManForEachCand( p, pObj, i )
        if ( Gia_ObjIsTail(p, i) )
            Counter += Ssc_GiaSimClassRefineOne( p, Gia_ObjRepr(p, i) );
        else if ( Gia_ObjIsConst(p, i) && !Ssc_GiaSimIsConst0(p, i) )
            Vec_IntPush( vRefinedC, i );
    Ssc_GiaSimProcessRefined( p, vRefinedC );
    Counter += Vec_IntSize( vRefinedC );
    Vec_IntFree( vRefinedC );
    return Counter;
}